

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O0

size_t ZSTD_ldm_generateSequences
                 (ldmState_t *ldmState,rawSeqStore_t *sequences,ldmParams_t *params,void *src,
                 size_t srcSize)

{
  ulong uVar1;
  U32 maxDist_00;
  U32 UVar2;
  U32 reducerValue;
  uint uVar3;
  void *src_00;
  BYTE *code;
  bool bVar4;
  void *local_b8;
  U32 correction;
  U32 ldmHSize;
  size_t prevSize;
  size_t newLeftoverSize;
  size_t chunkSize;
  BYTE *chunkEnd;
  size_t remaining;
  BYTE *chunkStart;
  size_t leftoverSize;
  size_t chunk;
  size_t nbChunks;
  size_t kMaxChunkSize;
  BYTE *iend;
  BYTE *istart;
  U32 maxDist;
  size_t srcSize_local;
  void *src_local;
  ldmParams_t *params_local;
  rawSeqStore_t *sequences_local;
  ldmState_t *ldmState_local;
  
  maxDist_00 = 1 << ((byte)params->windowLog & 0x1f);
  chunkStart = (BYTE *)0x0;
  leftoverSize = 0;
  while( true ) {
    bVar4 = false;
    if (leftoverSize < (srcSize >> 0x14) + (long)(int)(uint)((srcSize & 0xfffff) != 0)) {
      bVar4 = sequences->size < sequences->capacity;
    }
    if (!bVar4) {
      return 0;
    }
    src_00 = (void *)((long)src + leftoverSize * 0x100000);
    local_b8 = (void *)((long)src + srcSize);
    if (0xfffff < (ulong)((long)((long)src + srcSize) - (long)src_00)) {
      local_b8 = (void *)((long)src_00 + 0x100000);
    }
    uVar1 = sequences->size;
    UVar2 = ZSTD_window_needOverflowCorrection(ldmState->window,local_b8);
    if (UVar2 != 0) {
      UVar2 = params->hashLog;
      reducerValue = ZSTD_window_correctOverflow(&ldmState->window,0,maxDist_00,src);
      ZSTD_ldm_reduceTable(ldmState->hashTable,1 << ((byte)UVar2 & 0x1f),reducerValue);
    }
    ZSTD_window_enforceMaxDist
              (&ldmState->window,local_b8,maxDist_00,(U32 *)0x0,(ZSTD_matchState_t **)0x0);
    code = (BYTE *)ZSTD_ldm_generateSequences_internal
                             (ldmState,sequences,params,src_00,(long)local_b8 - (long)src_00);
    uVar3 = ERR_isError((size_t)code);
    if (uVar3 != 0) break;
    if (uVar1 < sequences->size) {
      sequences->seq[uVar1].litLength = (int)chunkStart + sequences->seq[uVar1].litLength;
      chunkStart = code;
    }
    else {
      chunkStart = chunkStart + ((long)local_b8 - (long)src_00);
    }
    leftoverSize = leftoverSize + 1;
  }
  return (size_t)code;
}

Assistant:

size_t ZSTD_ldm_generateSequences(
        ldmState_t* ldmState, rawSeqStore_t* sequences,
        ldmParams_t const* params, void const* src, size_t srcSize)
{
    U32 const maxDist = 1U << params->windowLog;
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    size_t const kMaxChunkSize = 1 << 20;
    size_t const nbChunks = (srcSize / kMaxChunkSize) + ((srcSize % kMaxChunkSize) != 0);
    size_t chunk;
    size_t leftoverSize = 0;

    assert(ZSTD_CHUNKSIZE_MAX >= kMaxChunkSize);
    /* Check that ZSTD_window_update() has been called for this chunk prior
     * to passing it to this function.
     */
    assert(ldmState->window.nextSrc >= (BYTE const*)src + srcSize);
    /* The input could be very large (in zstdmt), so it must be broken up into
     * chunks to enforce the maximmum distance and handle overflow correction.
     */
    assert(sequences->pos <= sequences->size);
    assert(sequences->size <= sequences->capacity);
    for (chunk = 0; chunk < nbChunks && sequences->size < sequences->capacity; ++chunk) {
        BYTE const* const chunkStart = istart + chunk * kMaxChunkSize;
        size_t const remaining = (size_t)(iend - chunkStart);
        BYTE const *const chunkEnd =
            (remaining < kMaxChunkSize) ? iend : chunkStart + kMaxChunkSize;
        size_t const chunkSize = chunkEnd - chunkStart;
        size_t newLeftoverSize;
        size_t const prevSize = sequences->size;

        assert(chunkStart < iend);
        /* 1. Perform overflow correction if necessary. */
        if (ZSTD_window_needOverflowCorrection(ldmState->window, chunkEnd)) {
            U32 const ldmHSize = 1U << params->hashLog;
            U32 const correction = ZSTD_window_correctOverflow(
                &ldmState->window, /* cycleLog */ 0, maxDist, src);
            ZSTD_ldm_reduceTable(ldmState->hashTable, ldmHSize, correction);
        }
        /* 2. We enforce the maximum offset allowed.
         *
         * kMaxChunkSize should be small enough that we don't lose too much of
         * the window through early invalidation.
         * TODO: * Test the chunk size.
         *       * Try invalidation after the sequence generation and test the
         *         the offset against maxDist directly.
         */
        ZSTD_window_enforceMaxDist(&ldmState->window, chunkEnd, maxDist, NULL, NULL);
        /* 3. Generate the sequences for the chunk, and get newLeftoverSize. */
        newLeftoverSize = ZSTD_ldm_generateSequences_internal(
            ldmState, sequences, params, chunkStart, chunkSize);
        if (ZSTD_isError(newLeftoverSize))
            return newLeftoverSize;
        /* 4. We add the leftover literals from previous iterations to the first
         *    newly generated sequence, or add the `newLeftoverSize` if none are
         *    generated.
         */
        /* Prepend the leftover literals from the last call */
        if (prevSize < sequences->size) {
            sequences->seq[prevSize].litLength += (U32)leftoverSize;
            leftoverSize = newLeftoverSize;
        } else {
            assert(newLeftoverSize == chunkSize);
            leftoverSize += chunkSize;
        }
    }
    return 0;
}